

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.c
# Opt level: O0

void enet_peer_disconnect_now(ENetPeer *peer,enet_uint32 data)

{
  undefined1 local_44 [8];
  ENetProtocol command;
  enet_uint32 data_local;
  ENetPeer *peer_local;
  
  if (peer->state != ENET_PEER_STATE_DISCONNECTED) {
    command.connect.connectID = data;
    unique0x100000b7 = peer;
    if ((peer->state != ENET_PEER_STATE_ZOMBIE) && (peer->state != ENET_PEER_STATE_DISCONNECTING)) {
      enet_peer_reset_queues(peer);
      local_44[0] = 'D';
      local_44[1] = 0xff;
      local_44._4_4_ = htonl(command.connect.connectID);
      enet_peer_queue_outgoing_command
                (stack0xfffffffffffffff0,(ENetProtocol *)local_44,(ENetPacket *)0x0,0,0);
      enet_host_flush(stack0xfffffffffffffff0->host);
    }
    enet_peer_reset(stack0xfffffffffffffff0);
  }
  return;
}

Assistant:

void
enet_peer_disconnect_now (ENetPeer * peer, enet_uint32 data)
{
    ENetProtocol command;

    if (peer -> state == ENET_PEER_STATE_DISCONNECTED)
      return;

    if (peer -> state != ENET_PEER_STATE_ZOMBIE &&
        peer -> state != ENET_PEER_STATE_DISCONNECTING)
    {
        enet_peer_reset_queues (peer);

        command.header.command = ENET_PROTOCOL_COMMAND_DISCONNECT | ENET_PROTOCOL_COMMAND_FLAG_UNSEQUENCED;
        command.header.channelID = 0xFF;
        command.disconnect.data = ENET_HOST_TO_NET_32 (data);

        enet_peer_queue_outgoing_command (peer, & command, NULL, 0, 0);

        enet_host_flush (peer -> host);
    }

    enet_peer_reset (peer);
}